

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

void TrackUsedInit(Disk *disk)

{
  pointer puVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  size_t i_1;
  Data *pDVar7;
  ulong uVar8;
  exception *peVar9;
  uint uVar10;
  uint uVar11;
  size_t i;
  long lVar12;
  long lVar13;
  ulong uVar14;
  Sector *sector;
  MGT_DISK_INFO di;
  uint8_t abBAM [195];
  byte local_16a;
  byte local_169;
  Sector *local_168;
  ulong local_160;
  uint local_158;
  uint local_154;
  Disk *local_150;
  ulong local_148;
  ulong local_140;
  MGT_DISK_INFO local_138;
  Header local_108;
  byte local_f8 [200];
  
  memset(local_f8,0,0xc3);
  adwUsed[0][2] = 0;
  adwUsed[1][0] = 0;
  adwUsed[1][1] = 0;
  adwUsed[1][2] = 0;
  adwUsed[0][0] = 0x11;
  adwUsed[0][1] = 0;
  local_168 = (Sector *)0x0;
  Header::Header((Header *)&local_138,0,0,1,2);
  local_150 = disk;
  bVar4 = Disk::find(disk,(Header *)&local_138,&local_168);
  if ((!bVar4) || (iVar6 = Sector::data_size(local_168), iVar6 < 0x200)) {
    peVar9 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[23]>(peVar9,(char (*) [23])"disk is not MGT format");
    __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  local_138.disk_label._M_dataplus._M_p = (pointer)&local_138.disk_label.field_2;
  local_138.dos_type = SAMDOS;
  local_138.dir_tracks = 4;
  local_138.disk_label._M_string_length = 0;
  local_138.disk_label.field_2._M_local_buf[0] = '\0';
  local_138.serial_number = 0;
  pDVar7 = Sector::data_copy(local_168,0);
  GetDiskInfo((pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start,&local_138);
  local_169 = 0;
  if (0 < local_138.dir_tracks) {
    local_160 = 0;
    bVar4 = false;
    while (local_16a = 1, !bVar4) {
      local_140 = local_160 & 0xff;
      local_154 = 1 << ((byte)local_160 & 0x1f);
      uVar10 = (int)local_140 + 1;
      local_158 = 1 << ((byte)uVar10 & 0x1f);
      uVar8 = local_140 >> 5;
      local_148 = (ulong)(uVar10 >> 5);
      uVar14 = local_160 & 0xffffffff;
      do {
        bVar3 = local_16a;
        if (local_16a == 1 && (char)uVar14 == '\x04') {
          uVar14 = 4;
        }
        else {
          if ((char)uVar14 < '\0') {
            __assert_fail("cyl >= 0 && cyl < MAX_DISK_CYLS",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/include/Header.h"
                          ,0x29,"CylHead::CylHead(int, int)");
          }
          Header::Header(&local_108,(uint)uVar14 & 0xff,0,(uint)local_16a,2);
          bVar5 = Disk::find(local_150,&local_108,&local_168);
          if ((!bVar5) || (iVar6 = Sector::data_size(local_168), iVar6 < 0x200)) {
            peVar9 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::
            exception<char_const(&)[5],unsigned_char&,char_const(&)[16],unsigned_char&,char_const(&)[11]>
                      (peVar9,(char (*) [5])"cyl ",&local_169,(char (*) [16])" head 0 sector ",
                       &local_16a,(char (*) [11])0x1b079a);
            __cxa_throw(peVar9,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          if (bVar4) goto LAB_00177426;
          bVar5 = false;
          lVar13 = 0;
          do {
            pDVar7 = Sector::data_copy(local_168,0);
            puVar1 = (pDVar7->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((puVar1[lVar13] & 0x3f) == 0) {
              bVar4 = puVar1[lVar13 + 1] == '\0';
            }
            else {
              adwUsed[0][uVar8] = adwUsed[0][uVar8] | local_154;
              if ((bool)(bVar3 == 9 & bVar5)) {
                if (local_138.dir_tracks + -1 != (int)local_140) {
                  adwUsed[0][local_148] = adwUsed[0][local_148] | local_158;
                }
              }
              lVar12 = 0;
              do {
                local_f8[lVar12] = local_f8[lVar12] | puVar1[lVar12 + lVar13 + 0xf];
                lVar12 = lVar12 + 1;
              } while (lVar12 != 0xc3);
              uVar14 = local_160 & 0xffffffff;
            }
            lVar13 = 0x100;
            bVar2 = !bVar5;
            bVar5 = true;
          } while (bVar2 && !bVar4);
        }
        local_16a = bVar3 + 1;
      } while ((!bVar4) && (local_16a < 0xb));
      local_169 = (char)local_160 + 1;
      local_160 = CONCAT71((int7)(local_160 >> 8),local_169);
      if ((bool)(bVar4 | local_138.dir_tracks <= (int)(uint)local_169)) break;
    }
  }
LAB_00177426:
  uVar8 = 0;
  do {
    if ((local_f8[uVar8 >> 3] >> ((uint)uVar8 & 7) & 1) != 0) {
      uVar11 = ((uint)uVar8 & 0xffff) / 10;
      uVar10 = uVar11 - 0x4c;
      if (0x2f7 >= uVar8) {
        uVar10 = uVar11 + 4;
      }
      adwUsed[0x2f7 < uVar8][uVar10 >> 5] =
           adwUsed[0x2f7 < uVar8][uVar10 >> 5] | 1 << ((byte)uVar10 & 0x1f);
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 0x618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.disk_label._M_dataplus._M_p != &local_138.disk_label.field_2) {
    operator_delete(local_138.disk_label._M_dataplus._M_p,
                    CONCAT71(local_138.disk_label.field_2._M_allocated_capacity._1_7_,
                             local_138.disk_label.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void TrackUsedInit(Disk& disk)
{
    bool fDone = false;
    uint8_t abBAM[195] = {};

    // Tracks 0 and 4 cover the (empty) directory start and boot sector, and are always used
    memset(&adwUsed, 0, sizeof(adwUsed));
    adwUsed[0][0] |= 0x00000011;

    const Sector* sector = nullptr;
    if (!disk.find(Header(0, 0, 1, 2), sector) || sector->data_size() < SECTOR_SIZE)
        throw util::exception("disk is not MGT format");

    MGT_DISK_INFO di;
    const Data& data1 = sector->data_copy();
    GetDiskInfo(data1.data(), di);

    for (uint8_t cyl = 0; !fDone && cyl < di.dir_tracks; ++cyl)
    {
        for (uint8_t sec = 1; !fDone && sec <= MGT_SECTORS; ++sec)
        {
            // Skip the boot sector on MasterDOS extended directories
            if (cyl == 4 && sec == 1)
                continue;

            CylHead cylhead(cyl, 0);
            if (!disk.find(Header(cyl, 0, sec, 2), sector) || sector->data_size() < SECTOR_SIZE)
                throw util::exception("cyl ", cyl, " head 0 sector ", sec, " not found");

            for (int entry = 0; !fDone && entry < 2; ++entry)
            {
                const Data& data = sector->data_copy();
                const MGT_DIR* pdi = reinterpret_cast<const MGT_DIR*>(data.data() + ((SECTOR_SIZE / 2) * entry));

                if (pdi->bType & 0x3f)
                {
                    // Mark the current track as used
                    adwUsed[0][cyl >> 5] |= (1 << (cyl & 0x1f));

                    // If the final entry of the non-final track is in use, ensure the next track is considered used
                    if (entry == 1 && sec == (MGT_SECTORS - 1) && cyl != (di.dir_tracks - 1))
                        adwUsed[0][(cyl + 1) >> 5] |= (1 << ((cyl + 1) & 0x1f));

                    // Merge the sector address map into the overall disk BAM
                    for (size_t i = 0; i < sizeof(abBAM); ++i)
                        abBAM[i] |= pdi->abSectorMap[i];
                }
                else
                    fDone = !pdi->abName[0];
            }
        }
    }

    // Convert the BAM used sectors to our used tracks
    for (size_t i = 0; i < (sizeof(abBAM) << 3); ++i)
    {
        // Sector in use?
        if (abBAM[i >> 3] & (1 << (i & 7)))
        {
            uint8_t cyl = static_cast<uint8_t>((i / MGT_SECTORS) + MGT_DIR_TRACKS);
            uint8_t head = cyl / NORMAL_TRACKS;

            cyl %= NORMAL_TRACKS;
            adwUsed[head][cyl >> 5] |= (1 << (cyl & 0x1f));
        }
    }
}